

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O3

JsrtExternalObject * __thiscall JsrtExternalObject::Copy(JsrtExternalObject *this,bool deepCopy)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Recycler *pRVar5;
  undefined4 *puVar6;
  JsrtExternalObject *this_00;
  Type TVar7;
  type_info *ptVar8;
  type_info *ptVar9;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  pRVar5 = Js::RecyclableObject::GetRecycler((RecyclableObject *)this);
  pTVar1 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  TVar7 = 0;
  if (this->slotType != External) {
    TVar7 = (this->u).inlineSlotSize;
  }
  if (pTVar1[1].entryPoint == (Type)0x0) {
    ptVar9 = (type_info *)(long)(int)TVar7;
    data.typeinfo = ptVar9;
    if (pTVar1[1].prototype.ptr == (RecyclableObject *)0x0) {
      local_58 = (undefined1  [8])&typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_422dbd;
      data.filename._0_4_ = 0xb2;
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_58);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_003b5f36;
        *puVar6 = 0;
      }
      ptVar8 = (type_info *)&DAT_ffffffffffffffff;
      if (ptVar9 < (type_info *)0xffffffffffffffd0) {
        ptVar8 = ptVar9 + 0x30;
      }
      this_00 = (JsrtExternalObject *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                          (pRVar5,(size_t)ptVar8);
    }
    else {
      local_58 = (undefined1  [8])&typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_422dbd;
      data.filename._0_4_ = 0xaf;
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_58);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_003b5f36;
        *puVar6 = 0;
      }
      ptVar8 = (type_info *)&DAT_ffffffffffffffff;
      if (ptVar9 < (type_info *)0xffffffffffffffd0) {
        ptVar8 = ptVar9 + 0x30;
      }
      this_00 = (JsrtExternalObject *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)388,false>
                          (pRVar5,(size_t)ptVar8);
    }
  }
  else {
    ptVar9 = (type_info *)(long)(int)TVar7;
    local_58 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_422dbd;
    data.filename._0_4_ = 0xa9;
    data.typeinfo = ptVar9;
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_58);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_003b5f36;
      *puVar6 = 0;
    }
    ptVar8 = (type_info *)&DAT_ffffffffffffffff;
    if (ptVar9 < (type_info *)0xffffffffffffffd0) {
      ptVar8 = ptVar9 + 0x30;
    }
    this_00 = (JsrtExternalObject *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1428,false>
                        (pRVar5,(size_t)ptVar8);
  }
  if (this_00 == (JsrtExternalObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_003b5f36:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  JsrtExternalObject(this_00,this,deepCopy);
  return this_00;
}

Assistant:

JsrtExternalObject* JsrtExternalObject::Copy(bool deepCopy)
{
    Recycler* recycler = this->GetRecycler();
    JsrtExternalType* type = this->GetExternalType();
    int inlineSlotSize = this->GetInlineSlotSize();

#ifdef _CHAKRACOREBUILD
    if (type->GetJsTraceCallback() != nullptr)
    {
        return RecyclerNewTrackedPlus(recycler, inlineSlotSize, JsrtExternalObject, this, deepCopy);
    }
#endif

    if (type->GetJsFinalizeCallback() != nullptr)
    {
        return RecyclerNewFinalizedPlus(recycler, inlineSlotSize, JsrtExternalObject, this, deepCopy);
    }

    return RecyclerNewPlus(recycler, inlineSlotSize, JsrtExternalObject, this, deepCopy);
}